

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall helics::MessageFederate::loadFederateData(MessageFederate *this)

{
  bool bVar1;
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  *in_RDI;
  MessageFederate **unaff_retaddr;
  Core **in_stack_00000008;
  string *in_stack_00000018;
  MessageFederate *in_stack_00000020;
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  *in_stack_ffffffffffffffc8;
  bool *in_stack_fffffffffffffff0;
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  *__args_2;
  
  __args_2 = in_RDI;
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&in_RDI[3]._M_t.
                     super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                     .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl +
             *(long *)((long)&(in_RDI->_M_t).
                              super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                              .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>.
                              _M_head_impl[-1].messageOrder.m_mutex + 0x18)));
  Federate::getID((Federate *)
                  ((long)&(in_RDI->_M_t).
                          super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                          .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>.
                          _M_head_impl +
                  *(long *)((long)&(in_RDI->_M_t).
                                   super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                                   .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>.
                                   _M_head_impl[-1].messageOrder.m_mutex + 0x18)));
  std::
  make_unique<helics::MessageFederateManager,helics::Core*,helics::MessageFederate*,helics::LocalFederateId,bool&>
            (in_stack_00000008,unaff_retaddr,(LocalFederateId *)__args_2,in_stack_fffffffffffffff0);
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  operator=(in_RDI,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  ~unique_ptr(in_RDI);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x268b5d);
  if (!bVar1) {
    registerMessageInterfaces(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}